

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

void transpose32a(uint *a)

{
  int j;
  uint uVar1;
  uint uVar2;
  unsigned_long m;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = 0x10;
  uVar3 = 0xffff;
  while (uVar1 != 0) {
    uVar5 = 0;
    while ((int)uVar5 < 0x20) {
      uVar4 = uVar5 | uVar1;
      uVar2 = (a[(int)uVar4] >> (sbyte)uVar1 ^ a[(int)uVar5]) & (uint)uVar3;
      a[(int)uVar5] = uVar2 ^ a[(int)uVar5];
      a[(int)uVar4] = a[(int)uVar4] ^ uVar2 << (sbyte)uVar1;
      uVar5 = uVar4 + 1 & ~uVar1;
    }
    uVar1 = uVar1 >> 1;
    uVar3 = uVar3 ^ uVar3 << (sbyte)uVar1;
  }
  return;
}

Assistant:

void transpose32a( unsigned a[32] ) 
{
    int j, k;
    unsigned long m, t;
    for ( j = 16, m = 0x0000FFFF; j; j >>= 1, m ^= m << j ) 
    {
        for ( k = 0; k < 32; k = ((k | j) + 1) & ~j ) 
        {
            t = (a[k] ^ (a[k|j] >> j)) & m;
            a[k] ^= t;
            a[k|j] ^= (t << j);
        }
    }
}